

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall
TStokesAnalytic::Force(TStokesAnalytic *this,TPZVec<double> *x,TPZVec<double> *force)

{
  int i;
  long lVar1;
  double *pdVar2;
  int f;
  long lVar3;
  long lVar4;
  int e;
  double dVar5;
  TPZManVector<double,_3> xst;
  TPZManVector<double,_3> beta;
  TPZManVector<double,_3> locforce;
  TPZManVector<double,_3> gradU_beta;
  TPZManVector<double,_3> gradUt_beta;
  TPZFMatrix<double> local_1d8;
  TPZManVector<double,_3> local_148;
  TPZManVector<double,_3> local_110;
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_d8,3,(double *)&local_1d8);
  local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_110,3,(double *)&local_1d8);
  local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_a0,3,(double *)&local_1d8);
  local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_68,3,(double *)&local_1d8);
  TPZManVector<double,_3>::TPZManVector(&local_148,3);
  local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_1d8.fElem = (double *)0x0;
  local_1d8.fGiven = (double *)0x0;
  local_1d8.fSize = 0;
  TPZVec<int>::TPZVec(&local_1d8.fPivot.super_TPZVec<int>,0);
  local_1d8.fPivot.super_TPZVec<int>.fStore = local_1d8.fPivot.fExtAlloc;
  local_1d8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1d8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1d8.fWork.fStore = (double *)0x0;
  local_1d8.fWork.fNElements = 0;
  local_1d8.fWork.fNAlloc = 0;
  local_1d8.fElem = (double *)operator_new__(0x48);
  local_1d8.fElem[6] = 0.0;
  local_1d8.fElem[7] = 0.0;
  local_1d8.fElem[4] = 0.0;
  local_1d8.fElem[5] = 0.0;
  local_1d8.fElem[2] = 0.0;
  local_1d8.fElem[3] = 0.0;
  *local_1d8.fElem = 0.0;
  local_1d8.fElem[1] = 0.0;
  local_1d8.fElem[8] = 0.0;
  pdVar2 = x->fStore;
  lVar1 = 0;
  do {
    local_148.super_TPZVec<double>.fStore[lVar1] = pdVar2[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  DivSigma<double>(this,x,&local_d8.super_TPZVec<double>);
  switch(this->fProblemType) {
  case EStokes:
    pdVar2 = force->fStore;
    *pdVar2 = -*local_d8.super_TPZVec<double>.fStore;
    pdVar2[1] = -local_d8.super_TPZVec<double>.fStore[1];
    pdVar2[2] = -local_d8.super_TPZVec<double>.fStore[2];
    goto LAB_013cf3e3;
  case ENavierStokes:
  case EOseen:
    graduxy<double>(this,&local_148.super_TPZVec<double>,&local_1d8);
    uxy<double>(this,&local_148.super_TPZVec<double>,&local_110.super_TPZVec<double>);
    lVar1 = 0;
    do {
      lVar3 = 0;
      do {
        if ((local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar1) ||
           (local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_a0.super_TPZVec<double>.fStore[lVar1] =
             local_1d8.fElem
             [local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + lVar1] *
             local_110.super_TPZVec<double>.fStore[lVar3] +
             local_a0.super_TPZVec<double>.fStore[lVar1];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    pdVar2 = force->fStore;
    *pdVar2 = *local_a0.super_TPZVec<double>.fStore - *local_d8.super_TPZVec<double>.fStore;
    pdVar2[1] = local_a0.super_TPZVec<double>.fStore[1] - local_d8.super_TPZVec<double>.fStore[1];
    dVar5 = local_a0.super_TPZVec<double>.fStore[2] - local_d8.super_TPZVec<double>.fStore[2];
    break;
  case ENavierStokesCDG:
  case EOseenCDG:
    graduxy<double>(this,&local_148.super_TPZVec<double>,&local_1d8);
    uxy<double>(this,&local_148.super_TPZVec<double>,&local_110.super_TPZVec<double>);
    lVar1 = 0;
    do {
      lVar3 = 0;
      do {
        if ((local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar1) ||
           (local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_a0.super_TPZVec<double>.fStore[lVar1] =
             local_1d8.fElem
             [local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3 + lVar1] *
             local_110.super_TPZVec<double>.fStore[lVar3] +
             local_a0.super_TPZVec<double>.fStore[lVar1];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    lVar3 = 0;
    lVar1 = 0;
    do {
      lVar4 = 0;
      do {
        if ((local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar4) ||
           (local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_68.super_TPZVec<double>.fStore[lVar1] =
             *(double *)
              ((long)local_1d8.fElem +
              lVar4 * 8 + lVar3 * local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) *
             local_110.super_TPZVec<double>.fStore[lVar4] +
             local_68.super_TPZVec<double>.fStore[lVar1];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar1 = lVar1 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar1 != 3);
    pdVar2 = force->fStore;
    *pdVar2 = (*local_a0.super_TPZVec<double>.fStore - *local_d8.super_TPZVec<double>.fStore) -
              *local_68.super_TPZVec<double>.fStore;
    pdVar2[1] = (local_a0.super_TPZVec<double>.fStore[1] - local_d8.super_TPZVec<double>.fStore[1])
                - local_68.super_TPZVec<double>.fStore[1];
    dVar5 = (local_a0.super_TPZVec<double>.fStore[2] - local_d8.super_TPZVec<double>.fStore[2]) -
            local_68.super_TPZVec<double>.fStore[2];
    break;
  case EBrinkman:
    uxy<double>(this,&local_148.super_TPZVec<double>,&local_110.super_TPZVec<double>);
    pdVar2 = force->fStore;
    *pdVar2 = this->fcBrinkman * *local_110.super_TPZVec<double>.fStore -
              *local_d8.super_TPZVec<double>.fStore;
    pdVar2[1] = this->fcBrinkman * local_110.super_TPZVec<double>.fStore[1] -
                local_d8.super_TPZVec<double>.fStore[1];
    pdVar2[2] = this->fcBrinkman * local_110.super_TPZVec<double>.fStore[2] -
                local_d8.super_TPZVec<double>.fStore[2];
    graduxy<double>(this,&local_148.super_TPZVec<double>,&local_1d8);
    if (local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1 ||
        local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2 ||
        local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
       (local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    force->fStore[3] =
         *local_1d8.fElem +
         local_1d8.fElem[local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] +
         local_1d8.fElem[local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 2];
    goto LAB_013cf3e3;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
               ,0xa57);
  }
  pdVar2[2] = dVar5;
LAB_013cf3e3:
  TPZFMatrix<double>::~TPZFMatrix(&local_1d8);
  TPZManVector<double,_3>::~TPZManVector(&local_148);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_110);
  TPZManVector<double,_3>::~TPZManVector(&local_d8);
  return;
}

Assistant:

void TStokesAnalytic::Force(const TPZVec<REAL> &x, TPZVec<STATE> &force) const
{

    TPZManVector<STATE,3> locforce(3,0.),beta(3,0.),gradU_beta(3,0.),gradUt_beta(3,0.),xst(3);
    TPZFMatrix<STATE> grad(3,3,0.);
    for(int i=0; i<3; i++) xst[i] = x[i];
    DivSigma(x, locforce);

    switch(fProblemType)
    {
        case EStokes:
            force[0] = -locforce[0];
            force[1] = -locforce[1];
            force[2] = -locforce[2];
            break;

        case EBrinkman:
    	    uxy(xst,beta);
            force[0] = -locforce[0]+fcBrinkman*beta[0];
            force[1] = -locforce[1]+fcBrinkman*beta[1];
            force[2] = -locforce[2]+fcBrinkman*beta[2];
	    graduxy(xst,grad);
            force[3] = grad(0,0)+grad(1,1)+grad(2,2); //Pressure block term
            break;
            
        case ENavierStokes:
        case EOseen:

            graduxy(xst,grad);
            uxy(xst,beta);
            
            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradU_beta[e] += grad(e,f)*beta[f];
                }
            }
            
            force[0] = -locforce[0]+gradU_beta[0];
            force[1] = -locforce[1]+gradU_beta[1];
            force[2] = -locforce[2]+gradU_beta[2];
            break;

        case ENavierStokesCDG:
        case EOseenCDG:

            graduxy(xst,grad);
            uxy(xst,beta);

            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradU_beta[e] += grad(e,f)*beta[f];
                }
            }

            for (int e=0; e<3; e++) {
                for (int f=0; f<3; f++) {
                    gradUt_beta[e] += grad(f,e)*beta[f];
                }
            }

            force[0] = -locforce[0]+gradU_beta[0]-gradUt_beta[0];
            force[1] = -locforce[1]+gradU_beta[1]-gradUt_beta[1];
            force[2] = -locforce[2]+gradU_beta[2]-gradUt_beta[2];
            break;
            
        default:
            DebugStop();
    }



}